

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colamd.c
# Opt level: O0

int init_rows_cols(int n_row,int n_col,Colamd_Row *Row,Colamd_Col *Col,int *A,int *p,int *stats)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int local_64;
  int last_row;
  int *rp_end;
  int *rp;
  int *cp_end;
  int *cp;
  int row;
  int col;
  int *p_local;
  int *A_local;
  Colamd_Col *Col_local;
  Colamd_Row *Row_local;
  int n_col_local;
  int n_row_local;
  
  for (cp._4_4_ = 0; cp._4_4_ < n_col; cp._4_4_ = cp._4_4_ + 1) {
    Col[cp._4_4_].start = p[cp._4_4_];
    Col[cp._4_4_].length = p[cp._4_4_ + 1] - p[cp._4_4_];
    if (Col[cp._4_4_].length < 0) {
      stats[3] = -8;
      stats[4] = cp._4_4_;
      stats[5] = Col[cp._4_4_].length;
      return 0;
    }
    Col[cp._4_4_].shared1.thickness = 1;
    Col[cp._4_4_].shared2.score = 0;
    Col[cp._4_4_].shared3.headhash = -1;
    Col[cp._4_4_].shared4.degree_next = -1;
  }
  stats[6] = 0;
  for (cp._0_4_ = 0; (int)cp < n_row; cp._0_4_ = (int)cp + 1) {
    Row[(int)cp].length = 0;
    Row[(int)cp].shared2.mark = -1;
  }
  cp._4_4_ = 0;
  do {
    if (n_col <= cp._4_4_) {
      Row->start = p[n_col];
      Row->shared1 = (anon_union_4_2_34273927_for_shared1)Row->start;
      (Row->shared2).mark = -1;
      for (cp._0_4_ = 1; (int)cp < n_row; cp._0_4_ = (int)cp + 1) {
        Row[(int)cp].start = Row[(int)cp + -1].start + Row[(int)cp + -1].length;
        Row[(int)cp].shared1 = *(anon_union_4_2_34273927_for_shared1 *)(Row + (int)cp);
        Row[(int)cp].shared2.mark = -1;
      }
      if (stats[3] == 1) {
        for (cp._4_4_ = 0; cp._4_4_ < n_col; cp._4_4_ = cp._4_4_ + 1) {
          iVar1 = p[cp._4_4_ + 1];
          cp_end = A + p[cp._4_4_];
          while (cp_end < A + iVar1) {
            piVar4 = cp_end + 1;
            iVar2 = *cp_end;
            cp_end = piVar4;
            if (Row[iVar2].shared2.mark != cp._4_4_) {
              iVar3 = Row[iVar2].shared1.degree;
              Row[iVar2].shared1.degree = iVar3 + 1;
              A[iVar3] = cp._4_4_;
              Row[iVar2].shared2.mark = cp._4_4_;
            }
          }
        }
      }
      else {
        for (cp._4_4_ = 0; cp._4_4_ < n_col; cp._4_4_ = cp._4_4_ + 1) {
          iVar1 = p[cp._4_4_ + 1];
          cp_end = A + p[cp._4_4_];
          while (cp_end < A + iVar1) {
            iVar2 = Row[*cp_end].shared1.degree;
            Row[*cp_end].shared1.degree = iVar2 + 1;
            A[iVar2] = cp._4_4_;
            cp_end = cp_end + 1;
          }
        }
      }
      for (cp._0_4_ = 0; (int)cp < n_row; cp._0_4_ = (int)cp + 1) {
        Row[(int)cp].shared2.mark = 0;
        Row[(int)cp].shared1 = (anon_union_4_2_34273927_for_shared1)Row[(int)cp].length;
      }
      if (stats[3] == 1) {
        Col->start = 0;
        *p = Col->start;
        for (cp._4_4_ = 1; cp._4_4_ < n_col; cp._4_4_ = cp._4_4_ + 1) {
          Col[cp._4_4_].start = Col[cp._4_4_ + -1].start + Col[cp._4_4_ + -1].length;
          p[cp._4_4_] = Col[cp._4_4_].start;
        }
        for (cp._0_4_ = 0; (int)cp < n_row; cp._0_4_ = (int)cp + 1) {
          iVar1 = Row[(int)cp].start;
          iVar2 = Row[(int)cp].length;
          rp_end = A + iVar1;
          while (rp_end < A + iVar1 + iVar2) {
            iVar3 = p[*rp_end];
            p[*rp_end] = iVar3 + 1;
            A[iVar3] = (int)cp;
            rp_end = rp_end + 1;
          }
        }
      }
      return 1;
    }
    local_64 = -1;
    iVar1 = p[cp._4_4_ + 1];
    cp_end = A + p[cp._4_4_];
    while (cp_end < A + iVar1) {
      iVar2 = *cp_end;
      if ((iVar2 < 0) || (n_row <= iVar2)) {
        stats[3] = -9;
        stats[4] = cp._4_4_;
        stats[5] = iVar2;
        stats[6] = n_row;
        return 0;
      }
      if ((iVar2 <= local_64) || (Row[iVar2].shared2.mark == cp._4_4_)) {
        stats[3] = 1;
        stats[4] = cp._4_4_;
        stats[5] = iVar2;
        stats[6] = stats[6] + 1;
      }
      if (Row[iVar2].shared2.mark == cp._4_4_) {
        Col[cp._4_4_].length = Col[cp._4_4_].length + -1;
      }
      else {
        Row[iVar2].length = Row[iVar2].length + 1;
      }
      Row[iVar2].shared2.mark = cp._4_4_;
      local_64 = iVar2;
      cp_end = cp_end + 1;
    }
    cp._4_4_ = cp._4_4_ + 1;
  } while( true );
}

Assistant:

PRIVATE Int init_rows_cols	/* returns TRUE if OK, or FALSE otherwise */
(
    /* === Parameters ======================================================= */

    Int n_row,			/* number of rows of A */
    Int n_col,			/* number of columns of A */
    Colamd_Row Row [],		/* of size n_row+1 */
    Colamd_Col Col [],		/* of size n_col+1 */
    Int A [],			/* row indices of A, of size Alen */
    Int p [],			/* pointers to columns in A, of size n_col+1 */
    Int stats [COLAMD_STATS]	/* colamd statistics */ 
)
{
    /* === Local variables ================================================== */

    Int col ;			/* a column index */
    Int row ;			/* a row index */
    Int *cp ;			/* a column pointer */
    Int *cp_end ;		/* a pointer to the end of a column */
    Int *rp ;			/* a row pointer */
    Int *rp_end ;		/* a pointer to the end of a row */
    Int last_row ;		/* previous row */

    /* === Initialize columns, and check column pointers ==================== */

    for (col = 0 ; col < n_col ; col++)
    {
	Col [col].start = p [col] ;
	Col [col].length = p [col+1] - p [col] ;

	if (Col [col].length < 0)
	{
	    /* column pointers must be non-decreasing */
	    stats [COLAMD_STATUS] = COLAMD_ERROR_col_length_negative ;
	    stats [COLAMD_INFO1] = col ;
	    stats [COLAMD_INFO2] = Col [col].length ;
	    DEBUG0 (("colamd: col %d length %d < 0\n", col, Col [col].length)) ;
	    return (FALSE) ;
	}

	Col [col].shared1.thickness = 1 ;
	Col [col].shared2.score = 0 ;
	Col [col].shared3.prev = COLAMD_EMPTY ;
	Col [col].shared4.degree_next = COLAMD_EMPTY ;
    }

    /* p [0..n_col] no longer needed, used as "head" in subsequent routines */

    /* === Scan columns, compute row degrees, and check row indices ========= */

    stats [COLAMD_INFO3] = 0 ;	/* number of duplicate or unsorted row indices*/

    for (row = 0 ; row < n_row ; row++)
    {
	Row [row].length = 0 ;
	Row [row].shared2.mark = -1 ;
    }

    for (col = 0 ; col < n_col ; col++)
    {
	last_row = -1 ;

	cp = &A [p [col]] ;
	cp_end = &A [p [col+1]] ;

	while (cp < cp_end)
	{
	    row = *cp++ ;

	    /* make sure row indices within range */
	    if (row < 0 || row >= n_row)
	    {
		stats [COLAMD_STATUS] = COLAMD_ERROR_row_index_out_of_bounds ;
		stats [COLAMD_INFO1] = col ;
		stats [COLAMD_INFO2] = row ;
		stats [COLAMD_INFO3] = n_row ;
		DEBUG0 (("colamd: row %d col %d out of bounds\n", row, col)) ;
		return (FALSE) ;
	    }

	    if (row <= last_row || Row [row].shared2.mark == col)
	    {
		/* row index are unsorted or repeated (or both), thus col */
		/* is jumbled.  This is a notice, not an error condition. */
		stats [COLAMD_STATUS] = COLAMD_OK_BUT_JUMBLED ;
		stats [COLAMD_INFO1] = col ;
		stats [COLAMD_INFO2] = row ;
		(stats [COLAMD_INFO3]) ++ ;
		DEBUG1 (("colamd: row %d col %d unsorted/duplicate\n",row,col));
	    }

	    if (Row [row].shared2.mark != col)
	    {
		Row [row].length++ ;
	    }
	    else
	    {
		/* this is a repeated entry in the column, */
		/* it will be removed */
		Col [col].length-- ;
	    }

	    /* mark the row as having been seen in this column */
	    Row [row].shared2.mark = col ;

	    last_row = row ;
	}
    }

    /* === Compute row pointers ============================================= */

    /* row form of the matrix starts directly after the column */
    /* form of matrix in A */
    Row [0].start = p [n_col] ;
    Row [0].shared1.p = Row [0].start ;
    Row [0].shared2.mark = -1 ;
    for (row = 1 ; row < n_row ; row++)
    {
	Row [row].start = Row [row-1].start + Row [row-1].length ;
	Row [row].shared1.p = Row [row].start ;
	Row [row].shared2.mark = -1 ;
    }

    /* === Create row form ================================================== */

    if (stats [COLAMD_STATUS] == COLAMD_OK_BUT_JUMBLED)
    {
	/* if cols jumbled, watch for repeated row indices */
	for (col = 0 ; col < n_col ; col++)
	{
	    cp = &A [p [col]] ;
	    cp_end = &A [p [col+1]] ;
	    while (cp < cp_end)
	    {
		row = *cp++ ;
		if (Row [row].shared2.mark != col)
		{
		    A [(Row [row].shared1.p)++] = col ;
		    Row [row].shared2.mark = col ;
		}
	    }
	}
    }
    else
    {
	/* if cols not jumbled, we don't need the mark (this is faster) */
	for (col = 0 ; col < n_col ; col++)
	{
	    cp = &A [p [col]] ;
	    cp_end = &A [p [col+1]] ;
	    while (cp < cp_end)
	    {
		A [(Row [*cp++].shared1.p)++] = col ;
	    }
	}
    }

    /* === Clear the row marks and set row degrees ========================== */

    for (row = 0 ; row < n_row ; row++)
    {
	Row [row].shared2.mark = 0 ;
	Row [row].shared1.degree = Row [row].length ;
    }

    /* === See if we need to re-create columns ============================== */

    if (stats [COLAMD_STATUS] == COLAMD_OK_BUT_JUMBLED)
    {
    	DEBUG0 (("colamd: reconstructing column form, matrix jumbled\n")) ;

#ifndef NDEBUG
	/* make sure column lengths are correct */
	for (col = 0 ; col < n_col ; col++)
	{
	    p [col] = Col [col].length ;
	}
	for (row = 0 ; row < n_row ; row++)
	{
	    rp = &A [Row [row].start] ;
	    rp_end = rp + Row [row].length ;
	    while (rp < rp_end)
	    {
		p [*rp++]-- ;
	    }
	}
	for (col = 0 ; col < n_col ; col++)
	{
	    ASSERT (p [col] == 0) ;
	}
	/* now p is all zero (different than when debugging is turned off) */
#endif /* NDEBUG */

	/* === Compute col pointers ========================================= */

	/* col form of the matrix starts at A [0]. */
	/* Note, we may have a gap between the col form and the row */
	/* form if there were duplicate entries, if so, it will be */
	/* removed upon the first garbage collection */
	Col [0].start = 0 ;
	p [0] = Col [0].start ;
	for (col = 1 ; col < n_col ; col++)
	{
	    /* note that the lengths here are for pruned columns, i.e. */
	    /* no duplicate row indices will exist for these columns */
	    Col [col].start = Col [col-1].start + Col [col-1].length ;
	    p [col] = Col [col].start ;
	}

	/* === Re-create col form =========================================== */

	for (row = 0 ; row < n_row ; row++)
	{
	    rp = &A [Row [row].start] ;
	    rp_end = rp + Row [row].length ;
	    while (rp < rp_end)
	    {
		A [(p [*rp++])++] = row ;
	    }
	}
    }

    /* === Done.  Matrix is not (or no longer) jumbled ====================== */

    return (TRUE) ;
}